

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

void lua_rawseti(lua_State *L,int idx,int n)

{
  TValue *pTVar1;
  lua_State *L_00;
  ulong uVar2;
  uint in_EDX;
  int in_ESI;
  lua_State *in_RDI;
  TValue *src;
  TValue *dst;
  GCtab *t;
  GCobj *o;
  TValue *local_60;
  undefined8 in_stack_ffffffffffffffa8;
  GCtab *in_stack_ffffffffffffffb0;
  
  pTVar1 = index2adr(in_RDI,in_ESI);
  L_00 = (lua_State *)(ulong)(pTVar1->u32).lo;
  if (in_EDX < *(uint *)&L_00->top) {
    local_60 = (TValue *)((ulong)(L_00->glref).ptr32 + (long)(int)in_EDX * 8);
  }
  else {
    local_60 = lj_tab_setinth(L_00,in_stack_ffffffffffffffb0,
                              (int32_t)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
  }
  pTVar1 = in_RDI->top;
  *local_60 = pTVar1[-1];
  if (((0xfffffff6 < (local_60->field_2).it + 4) &&
      ((*(byte *)((ulong)(local_60->u32).lo + 4) & 3) != 0)) && ((L_00->marked & 4) != 0)) {
    uVar2 = (ulong)(in_RDI->glref).ptr32;
    L_00->marked = L_00->marked & 0xfb;
    (L_00->gclist).gcptr32 = *(uint32_t *)(uVar2 + 0x3c);
    *(int *)(uVar2 + 0x3c) = (int)L_00;
  }
  in_RDI->top = pTVar1 + -1;
  return;
}

Assistant:

LUA_API void lua_rawseti(lua_State *L, int idx, int n)
{
  GCtab *t = tabV(index2adr(L, idx));
  TValue *dst, *src;
  api_checknelems(L, 1);
  dst = lj_tab_setint(L, t, n);
  src = L->top-1;
  copyTV(L, dst, src);
  lj_gc_barriert(L, t, dst);
  L->top = src;
}